

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::SetLiteralRegex(FunctionBody *this,uint index,RegexPattern *pattern)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<UnifiedRegex::RegexPattern> *pWVar5;
  
  uVar3 = GetLiteralRegexCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b7,"(index < GetLiteralRegexCount())",
                                "index < GetLiteralRegexCount()");
    if (!bVar2) goto LAB_006d45ba;
    *puVar4 = 0;
  }
  pWVar5 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)18,Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>*>
                     ((FunctionProxy *)this);
  if (pWVar5 == (WriteBarrierPtr<UnifiedRegex::RegexPattern> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b8,"(this->GetLiteralRegexes())","this->GetLiteralRegexes()");
    if (!bVar2) goto LAB_006d45ba;
    *puVar4 = 0;
  }
  pWVar5 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)18,Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>*>
                     ((FunctionProxy *)this);
  if (pWVar5[index].ptr != (RegexPattern *)0x0) {
    if (pWVar5[index].ptr == pattern) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19bf,"(!literalRegexes[index])","!literalRegexes[index]");
    if (!bVar2) {
LAB_006d45ba:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet(pWVar5 + index,pattern);
  return;
}

Assistant:

void FunctionBody::SetLiteralRegex(const uint index, UnifiedRegex::RegexPattern *const pattern)
    {
        Assert(index < GetLiteralRegexCount());
        Assert(this->GetLiteralRegexes());

        auto literalRegexes = this->GetLiteralRegexes();
        if (literalRegexes[index] && literalRegexes[index] == pattern)
        {
            return;
        }
        Assert(!literalRegexes[index]);

        literalRegexes[index] = pattern;
    }